

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit-array.hpp
# Opt level: O0

underlying_type __thiscall baryonyx::bit_array_impl::block(bit_array_impl *this,int index)

{
  bool bVar1;
  type puVar2;
  int index_local;
  bit_array_impl *this_local;
  
  bVar1 = false;
  if (-1 < index) {
    bVar1 = index < this->m_block_size;
  }
  if (!bVar1) {
    details::fail_fast("Assertion","index >= 0 && index < m_block_size",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/bit-array.hpp"
                       ,"121");
  }
  puVar2 = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::operator[]
                     (&this->m_data,(long)index);
  return *puVar2;
}

Assistant:

underlying_type block(int index) const noexcept
    {
        bx_assert(index >= 0 && index < m_block_size);

        return m_data[index];
    }